

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool __thiscall
dg::vr::RelationsAnalyzer::passFunction(RelationsAnalyzer *this,Function *function,bool print)

{
  VRLocation *location;
  pointer ppVVar1;
  VREdge *pVVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  LazyDFS it;
  LazyDFS LStack_d8;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> local_80;
  
  VRCodeGraph::lazy_dfs_begin(&LStack_d8,*(VRCodeGraph **)(this + 0x38),function);
  bVar5 = 0;
  while( true ) {
    VRCodeGraph::lazy_dfs_end();
    bVar3 = operator!=(&LStack_d8,&local_80);
    VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt(&local_80);
    if (!bVar3) break;
    location = LStack_d8.stack.
               super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Tuple_impl<0UL,_dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>.
               super__Head_base<0UL,_dg::vr::VRLocation_*,_false>._M_head_impl;
    ppVVar1 = (location->predecessors).
              super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar4 = (uint)((ulong)((long)(location->predecessors).
                                 super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3);
    if (uVar4 < 2) {
      if (uVar4 == 1) {
        pVVar2 = *ppVVar1;
        processOperation(this,pVVar2->source,pVVar2->target,
                         (VROp *)(pVVar2->op)._M_t.
                                 super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>
                                 ._M_t);
      }
    }
    else {
      mergeRelations(location);
      mergeRelationsByPointedTo(this,location);
    }
    bVar5 = bVar5 | (location->relations).changed;
    (location->relations).changed = false;
    VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(&LStack_d8);
  }
  VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt(&LStack_d8);
  return (bool)(bVar5 & 1);
}

Assistant:

bool RelationsAnalyzer::passFunction(const llvm::Function &function,
                                     __attribute__((unused)) bool print) {
    bool changed = false;

    for (auto it = codeGraph.lazy_dfs_begin(function);
         it != codeGraph.lazy_dfs_end(); ++it) {
        VRLocation &location = *it;
#ifndef NDEBUG
        const bool cond = location.id == 91;
        if (print && cond) {
            std::cerr << "LOCATION " << location.id << "\n";
            for (unsigned i = 0; i < location.predsSize(); ++i) {
                std::cerr << "pred" << i << " "
                          << location.getPredEdge(i)->op->toStr() << "\n";
                std::cerr << location.getPredLocation(i)->relations << "\n";
            }
            std::cerr << "before\n" << location.relations << "\n";
            std::cerr << "inside\n";
        }
#endif

        if (location.predsSize() > 1) {
            mergeRelations(location);
            mergeRelationsByPointedTo(location);
        } else if (location.predsSize() == 1) {
            VREdge *edge = location.getPredEdge(0);
            processOperation(edge->source, edge->target, edge->op.get());
        } // else no predecessors => nothing to be passed

        bool locationChanged = location.relations.unsetChanged();
#ifndef NDEBUG
        if (print && cond) {
            std::cerr << "after\n";
            if (locationChanged)
                std::cerr << location.relations;
            // return false;
        }
#endif
        changed |= locationChanged;
    }
    return changed;
}